

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O3

bool P_CheckForGLNodes(void)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  if (0 < (long)numsubsectors) {
    lVar2 = 0;
    do {
      uVar3 = (ulong)subsectors[lVar2].numlines;
      if ((subsectors[lVar2].firstline)->v1 != subsectors[lVar2].firstline[uVar3 - 1].v2) {
        return false;
      }
      if (uVar3 != 0) {
        lVar4 = 0;
        do {
          if (*(long *)((long)&segs->linedef + lVar4) == 0) {
            return true;
          }
          lVar4 = lVar4 + 0x30;
        } while (uVar3 * 0x30 != lVar4);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != numsubsectors);
  }
  uVar1 = CheckForMissingSegs();
  if (0 < (int)uVar1) {
    Printf("%d missing segs counted\nThe BSP needs to be rebuilt.\n",(ulong)uVar1);
  }
  return uVar1 == 0;
}

Assistant:

bool P_CheckForGLNodes()
{
	int i;

	for(i=0;i<numsubsectors;i++)
	{
		subsector_t * sub = &subsectors[i];
		seg_t * firstseg = sub->firstline;
		seg_t * lastseg = sub->firstline + sub->numlines - 1;

		if (firstseg->v1 != lastseg->v2)
		{
			// This subsector is incomplete which means that these
			// are normal nodes
			return false;
		}
		else
		{
			for(DWORD j=0;j<sub->numlines;j++)
			{
				if (segs[j].linedef==NULL)	// miniseg
				{
					// We already have GL nodes. Great!
					return true;
				}
			}
		}
	}
	// all subsectors were closed but there are no minisegs
	// Although unlikely this can happen. Such nodes are not a problem.
	// all that is left is to check whether the BSP covers all sidedefs completely.
	int missing = CheckForMissingSegs();
	if (missing > 0)
	{
		Printf("%d missing segs counted\nThe BSP needs to be rebuilt.\n", missing);
	}
	return missing == 0;
}